

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O3

int loader_load_from_file(char *tag,loader_path *paths,size_t size,void **handle)

{
  int iVar1;
  plugin p;
  loader_impl impl;
  
  iVar1 = loader_initialize();
  if (iVar1 == 0) {
    p = loader_get_impl_plugin(tag);
    if (p != (plugin)0x0) {
      impl = (loader_impl)plugin_impl(p);
      iVar1 = loader_impl_load_from_file(&loader_manager,p,impl,paths,size,handle);
      return iVar1;
    }
    log_write_impl_va("metacall",0x154,"loader_load_from_file",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                      ,LOG_LEVEL_ERROR,"Tried to load %zu file(s) from non existent loader (%s): %s"
                      ,size,tag,paths);
  }
  return 1;
}

Assistant:

int loader_load_from_file(const loader_tag tag, const loader_path paths[], size_t size, void **handle)
{
	if (loader_initialize() == 1)
	{
		return 1;
	}

	plugin p = loader_get_impl_plugin(tag);

	if (p == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Tried to load %" PRIuS " file(s) from non existent loader (%s): %s", size, tag, paths[0]);
		return 1;
	}

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "Loading %" PRIuS " file(s) (%s) from path(s): %s ...", size, tag, paths[0]); */

	return loader_impl_load_from_file(&loader_manager, p, plugin_impl_type(p, loader_impl), paths, size, handle);
}